

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

int __thiscall glslang::TScanContext::dMat(TScanContext *this)

{
  TParseContextBase *pTVar1;
  int iVar2;
  
  this->afterType = true;
  pTVar1 = this->parseContext;
  if ((pTVar1->super_TParseVersions).profile == EEsProfile) {
    if ((pTVar1->super_TParseVersions).version < 300) goto LAB_004417f8;
    reservedWord(this);
  }
  else {
    iVar2 = (pTVar1->super_TParseVersions).version;
    if ((((iVar2 < 400) &&
         (3 < (int)((ulong)((long)(pTVar1->symbolTable->table).
                                  super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar1->symbolTable->table).
                                 super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3))) &&
        ((iVar2 < 0x96 ||
         (iVar2 = (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[8])
                            (pTVar1,"GL_ARB_gpu_shader_fp64"), (char)iVar2 == '\0')))) &&
       (((pTVar1 = this->parseContext, (pTVar1->super_TParseVersions).version < 0x96 ||
         (iVar2 = (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[8])
                            (pTVar1,"GL_ARB_vertex_attrib_64bit"), (char)iVar2 == '\0')) ||
        ((this->parseContext->super_TParseVersions).language != EShLangVertex)))) {
LAB_004417f8:
      pTVar1 = this->parseContext;
      if ((pTVar1->super_TParseVersions).forwardCompatible == true) {
        (*(pTVar1->super_TParseVersions)._vptr_TParseVersions[0x2e])
                  (pTVar1,&this->loc,"using future type keyword",this->tokenText,"");
      }
      iVar2 = identifierOrType(this);
      return iVar2;
    }
  }
  return this->keyword;
}

Assistant:

int TScanContext::dMat()
{
    afterType = true;

    if (parseContext.isEsProfile() && parseContext.version >= 300) {
        reservedWord();

        return keyword;
    }

    if (!parseContext.isEsProfile() && (parseContext.version >= 400 ||
        parseContext.symbolTable.atBuiltInLevel() ||
        (parseContext.version >= 150 && parseContext.extensionTurnedOn(E_GL_ARB_gpu_shader_fp64)) ||
        (parseContext.version >= 150 && parseContext.extensionTurnedOn(E_GL_ARB_vertex_attrib_64bit)
         && parseContext.language == EShLangVertex)))
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future type keyword", tokenText, "");

    return identifierOrType();
}